

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-ctest.c
# Opt level: O0

void test47(char *infile,char *password,char *outfile,char *xarg)

{
  int iVar1;
  char *local_48;
  char *wanted_objects [3];
  FILE *f;
  char *xarg_local;
  char *outfile_local;
  char *password_local;
  char *infile_local;
  
  wanted_objects[2] = (char *)safe_fopen(outfile,"wb");
  iVar1 = qpdf_read(qpdf,infile,password);
  if (iVar1 == 0) {
    local_48 = "obj:4 0 R";
    wanted_objects[0] = "trailer";
    wanted_objects[1] = (char *)0x0;
    qpdf_write_json(qpdf,2,write_to_file,wanted_objects[2],2,2,xarg,&local_48);
    fclose((FILE *)wanted_objects[2]);
    report_errors();
    return;
  }
  __assert_fail("qpdf_read(qpdf, infile, password) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                ,0x524,"void test47(const char *, const char *, const char *, const char *)");
}

Assistant:

static void
test47(char const* infile, char const* password, char const* outfile, char const* xarg)
{
    FILE* f = safe_fopen(outfile, "wb");
    assert(qpdf_read(qpdf, infile, password) == 0);
    char const* wanted_objects[] = {"obj:4 0 R", "trailer", NULL};
    qpdf_write_json(
        qpdf, 2, write_to_file, f, qpdf_dl_specialized, qpdf_sj_file, xarg, wanted_objects);
    fclose(f);
    report_errors();
}